

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

int matchpattern(regex_t *pattern,char *text)

{
  int iVar1;
  bool bVar2;
  regex_t p;
  regex_t p_00;
  regex_t p_01;
  regex_t p_02;
  char *local_20;
  char *text_local;
  regex_t *pattern_local;
  
  local_20 = text;
  text_local = (char *)pattern;
  do {
    if ((*text_local == '\0') || (text_local[0x10] == '\x04')) {
      p._1_7_ = 0;
      p.type = *text_local;
      p.field_1.ccl = ((anon_union_8_2_c9599718_for_regex_t_1 *)(text_local + 8))->ccl;
      iVar1 = matchquestion(p,(regex_t *)(text_local + 0x20),local_20);
      return iVar1;
    }
    if (text_local[0x10] == '\x05') {
      p_00._1_7_ = 0;
      p_00.type = *text_local;
      p_00.field_1.ccl = ((anon_union_8_2_c9599718_for_regex_t_1 *)(text_local + 8))->ccl;
      iVar1 = matchstar(p_00,(regex_t *)(text_local + 0x20),local_20);
      return iVar1;
    }
    if (text_local[0x10] == '\x06') {
      p_01._1_7_ = 0;
      p_01.type = *text_local;
      p_01.field_1.ccl = ((anon_union_8_2_c9599718_for_regex_t_1 *)(text_local + 8))->ccl;
      iVar1 = matchplus(p_01,(regex_t *)(text_local + 0x20),local_20);
      return iVar1;
    }
    if ((*text_local == '\x03') && (text_local[0x10] == '\0')) {
      return (uint)(*local_20 == '\0');
    }
    bVar2 = false;
    if (*local_20 != '\0') {
      p_02._1_7_ = 0;
      p_02.type = *text_local;
      p_02.field_1.ccl = ((anon_union_8_2_c9599718_for_regex_t_1 *)(text_local + 8))->ccl;
      iVar1 = matchone(p_02,*local_20);
      bVar2 = iVar1 != 0;
      local_20 = local_20 + 1;
      text_local = text_local + 0x10;
    }
  } while (bVar2);
  return 0;
}

Assistant:

static int matchpattern(regex_t* pattern, const char* text)
{
  do
  {
    if ((pattern[0].type == UNUSED) || (pattern[1].type == QUESTIONMARK))
    {
      return matchquestion(pattern[0], &pattern[2], text);
    }
    else if (pattern[1].type == STAR)
    {
      return matchstar(pattern[0], &pattern[2], text);
    }
    else if (pattern[1].type == PLUS)
    {
      return matchplus(pattern[0], &pattern[2], text);
    }
    else if ((pattern[0].type == END) && pattern[1].type == UNUSED)
    {
      return (text[0] == '\0');
    }
/*  Branching is not working properly
    else if (pattern[1].type == BRANCH)
    {
      return (matchpattern(pattern, text) || matchpattern(&pattern[2], text));
    }
*/
  }
  while ((text[0] != '\0') && matchone(*pattern++, *text++));

  return 0;
}